

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O3

void find_predictors(AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME ref_frame,int_mv (*frame_mv) [8]
                    ,buf_2d (*yv12_mb) [3],BLOCK_SIZE bsize,int force_skip_low_temp_var,
                    int skip_pred_mv,_Bool *use_scaled_ref_frame)

{
  MACROBLOCKD *xd;
  CANDIDATE_MV (*paCVar1) [4];
  CANDIDATE_MV *pCVar2;
  CANDIDATE_MV *pCVar3;
  uint8_t uVar4;
  int iVar5;
  MB_MODE_INFO *mi;
  CANDIDATE_MV CVar6;
  CANDIDATE_MV CVar7;
  CANDIDATE_MV CVar8;
  long lVar9;
  YV12_BUFFER_CONFIG *pYVar10;
  scale_factors *scale;
  YV12_BUFFER_CONFIG *src;
  _Bool _Var11;
  RefCntBuffer *pRVar12;
  bool bVar13;
  
  if (((byte)(ref_frame - 1U) < 8) &&
     (lVar9 = (long)(cpi->common).remapped_ref_idx[(byte)ref_frame - 1], lVar9 != -1)) {
    pRVar12 = (cpi->common).ref_frame_map[lVar9];
  }
  else {
    pRVar12 = (RefCntBuffer *)0x0;
  }
  src = &pRVar12->buf;
  if (pRVar12 == (RefCntBuffer *)0x0) {
    src = (YV12_BUFFER_CONFIG *)0x0;
  }
  bVar13 = true;
  if ((src->field_3).field_0.y_crop_height == (cpi->common).height) {
    bVar13 = (src->field_2).field_0.y_crop_width != (cpi->common).width;
  }
  xd = &x->e_mbd;
  mi = *(x->e_mbd).mi;
  pYVar10 = av1_get_scaled_ref_frame(cpi,(int)ref_frame);
  _Var11 = (_Bool)(pYVar10 != (YV12_BUFFER_CONFIG *)0x0 & bVar13);
  if (_Var11 != false) {
    src = pYVar10;
  }
  uVar4 = ((cpi->common).seq_params)->monochrome;
  x->pred_mv_sad[ref_frame] = 0x7fffffff;
  x->pred_mv0_sad[ref_frame] = 0x7fffffff;
  x->pred_mv1_sad[ref_frame] = 0x7fffffff;
  frame_mv[0x10][ref_frame].as_int = 0x80008000;
  if ((pRVar12 != (RefCntBuffer *)0x0) || (_Var11 != false)) {
    if ((pYVar10 == (YV12_BUFFER_CONFIG *)0x0) &&
       (((byte)(ref_frame - 1U) < 8 &&
        (iVar5 = (cpi->common).remapped_ref_idx[(byte)ref_frame - 1], iVar5 != -1)))) {
      scale = (cpi->common).ref_scale_factors + iVar5;
    }
    else {
      scale = (scale_factors *)0x0;
    }
    av1_setup_pred_block(xd,yv12_mb[ref_frame],src,scale,scale,(uint)(uVar4 == '\0') * 2 + 1);
    av1_find_mv_refs(&cpi->common,xd,mi,ref_frame,(x->mbmi_ext).ref_mv_count,(x->e_mbd).ref_mv_stack
                     ,(x->e_mbd).weight,(int_mv (*) [2])0x0,(x->mbmi_ext).global_mvs,
                     (x->mbmi_ext).mode_context);
    (x->mbmi_ext).weight[ref_frame] = *(uint16_t (*) [4])(x->e_mbd).weight[ref_frame];
    pCVar2 = (x->e_mbd).ref_mv_stack[ref_frame];
    CVar6 = *pCVar2;
    CVar7 = pCVar2[1];
    pCVar3 = (x->e_mbd).ref_mv_stack[ref_frame] + 2;
    CVar8 = pCVar3[1];
    pCVar2 = (x->mbmi_ext).ref_mv_stack[ref_frame] + 2;
    *pCVar2 = *pCVar3;
    pCVar2[1] = CVar8;
    paCVar1 = (x->mbmi_ext).ref_mv_stack + ref_frame;
    (*paCVar1)[0] = CVar6;
    (*paCVar1)[1] = CVar7;
    av1_find_best_ref_mvs_from_stack
              ((uint)(cpi->common).features.allow_high_precision_mv,&x->mbmi_ext,ref_frame,
               frame_mv[0xd] + ref_frame,frame_mv[0xe] + ref_frame,0);
    frame_mv[0xf][ref_frame] = (x->mbmi_ext).global_mvs[ref_frame];
    if (((BLOCK_8X4 < bsize && bVar13 == false) && skip_pred_mv == 0) &&
       (ref_frame == '\x01' || force_skip_low_temp_var == 0)) {
      av1_mv_pred(cpi,x,yv12_mb[ref_frame][0].buf,(src->field_4).field_0.y_stride,(int)ref_frame,
                  bsize);
    }
  }
  if ((cpi->common).features.switchable_motion_mode == true) {
    av1_count_overlappable_neighbors(&cpi->common,xd);
  }
  mi->num_proj_ref = '\x01';
  *use_scaled_ref_frame = _Var11;
  return;
}

Assistant:

static inline void find_predictors(
    AV1_COMP *cpi, MACROBLOCK *x, MV_REFERENCE_FRAME ref_frame,
    int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES],
    struct buf_2d yv12_mb[8][MAX_MB_PLANE], BLOCK_SIZE bsize,
    int force_skip_low_temp_var, int skip_pred_mv, bool *use_scaled_ref_frame) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const YV12_BUFFER_CONFIG *ref = get_ref_frame_yv12_buf(cm, ref_frame);
  const bool ref_is_scaled =
      ref->y_crop_height != cm->height || ref->y_crop_width != cm->width;
  const YV12_BUFFER_CONFIG *scaled_ref =
      av1_get_scaled_ref_frame(cpi, ref_frame);
  const YV12_BUFFER_CONFIG *yv12 =
      ref_is_scaled && scaled_ref ? scaled_ref : ref;
  const int num_planes = av1_num_planes(cm);
  x->pred_mv_sad[ref_frame] = INT_MAX;
  x->pred_mv0_sad[ref_frame] = INT_MAX;
  x->pred_mv1_sad[ref_frame] = INT_MAX;
  frame_mv[NEWMV][ref_frame].as_int = INVALID_MV;
  // TODO(kyslov) this needs various further optimizations. to be continued..
  assert(yv12 != NULL);
  if (yv12 != NULL) {
    struct scale_factors *const sf =
        scaled_ref ? NULL : get_ref_scale_factors(cm, ref_frame);
    av1_setup_pred_block(xd, yv12_mb[ref_frame], yv12, sf, sf, num_planes);
    av1_find_mv_refs(cm, xd, mbmi, ref_frame, mbmi_ext->ref_mv_count,
                     xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                     mbmi_ext->mode_context);
    // TODO(Ravi): Populate mbmi_ext->ref_mv_stack[ref_frame][4] and
    // mbmi_ext->weight[ref_frame][4] inside av1_find_mv_refs.
    av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame);
    av1_find_best_ref_mvs_from_stack(
        cm->features.allow_high_precision_mv, mbmi_ext, ref_frame,
        &frame_mv[NEARESTMV][ref_frame], &frame_mv[NEARMV][ref_frame], 0);
    frame_mv[GLOBALMV][ref_frame] = mbmi_ext->global_mvs[ref_frame];
    // Early exit for non-LAST frame if force_skip_low_temp_var is set.
    if (!ref_is_scaled && bsize >= BLOCK_8X8 && !skip_pred_mv &&
        !(force_skip_low_temp_var && ref_frame != LAST_FRAME)) {
      av1_mv_pred(cpi, x, yv12_mb[ref_frame][0].buf, yv12->y_stride, ref_frame,
                  bsize);
    }
  }
  if (cm->features.switchable_motion_mode) {
    av1_count_overlappable_neighbors(cm, xd);
  }
  mbmi->num_proj_ref = 1;
  *use_scaled_ref_frame = ref_is_scaled && scaled_ref;
}